

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setLocationHints(XMLSchemaDescriptionImpl *this,XMLCh *hint)

{
  short *psVar1;
  BaseRefVectorOf<char16_t> *this_00;
  MemoryManager *pMVar2;
  XMLSize_t XVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t __n;
  char16_t *__dest;
  
  this_00 = &this->fLocationHints->super_BaseRefVectorOf<char16_t>;
  if (hint == (XMLCh *)0x0) {
    __dest = (char16_t *)0x0;
  }
  else {
    pMVar2 = (this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr;
    __n = 0;
    do {
      psVar1 = (short *)((long)hint + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    __dest = (char16_t *)CONCAT44(extraout_var,iVar4);
    memcpy(__dest,hint,__n);
  }
  BaseRefVectorOf<char16_t>::ensureExtraCapacity(this_00,1);
  XVar3 = this_00->fCurCount;
  this_00->fElemList[XVar3] = __dest;
  this_00->fCurCount = XVar3 + 1;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setLocationHints(const XMLCh* const hint)
{    
    fLocationHints->addElement(XMLString::replicate(hint, XMLGrammarDescription::getMemoryManager())); 
}